

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

void __thiscall
flatbuffers::ts::TsGenerator::TrackNsDef(TsGenerator *this,Definition *definition,string *type_name)

{
  size_type_conflict sVar1;
  reference pvVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_Definition_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  Definition *local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
  local_250;
  _Base_ptr local_228;
  undefined1 local_220;
  Definition *local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
  local_210;
  undefined1 local_1e8 [8];
  NsDefinition nsDef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string def_mod_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_a0;
  undefined1 local_80 [8];
  string symbolic_name;
  string filepath;
  string path;
  string *type_name_local;
  Definition *definition_local;
  TsGenerator *this_local;
  
  std::__cxx11::string::string((string *)(filepath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(symbolic_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_80);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&definition->defined_namespace->components);
  if (sVar1 == 0) {
    Namer::File<flatbuffers::Definition>
              ((string *)local_110,&(this->namer_).super_Namer,definition,SuffixAndExtension);
    std::__cxx11::string::operator=
              ((string *)local_80,(string *)(this->super_BaseGenerator).file_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (this->super_BaseGenerator).path_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_node_count,".ts");
    std::__cxx11::string::operator=
              ((string *)(symbolic_name.field_2._M_local_buf + 8),(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string
              ((string *)&nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_110);
  }
  else {
    IdlNamer::Directories_abi_cxx11_
              (&local_a0,&this->namer_,definition->defined_namespace,TrailingPathSeperator,
               kUpperCamel);
    std::__cxx11::string::operator=
              ((string *)(filepath.field_2._M_local_buf + 8),(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (filepath.field_2._M_local_buf + 8),".ts");
    std::__cxx11::string::operator=
              ((string *)(symbolic_name.field_2._M_local_buf + 8),(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    IdlNamer::Directories_abi_cxx11_
              ((string *)((long)&def_mod_name.field_2 + 8),&this->namer_,
               definition->defined_namespace,OutputPathAndTrailingPathSeparator,kUpperCamel);
    std::__cxx11::string::operator=
              ((string *)(filepath.field_2._M_local_buf + 8),
               (string *)(def_mod_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(def_mod_name.field_2._M_local_buf + 8));
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&definition->defined_namespace->components);
    std::__cxx11::string::operator=((string *)local_80,(string *)pvVar2);
  }
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(&this->ns_defs_,(key_type *)((long)&filepath.field_2 + 8));
  if (sVar3 == 0) {
    anon_unknown_10::NsDefinition::NsDefinition((NsDefinition *)local_1e8);
    std::__cxx11::string::operator=
              ((string *)local_1e8,(string *)(filepath.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)(nsDef.path.field_2._M_local_buf + 8),
               (string *)(symbolic_name.field_2._M_local_buf + 8));
    nsDef.symbolic_name.field_2._8_8_ = definition->defined_namespace;
    local_218 = definition;
    std::make_pair<std::__cxx11::string&,flatbuffers::Definition_const*>
              (&local_210,type_name,&local_218);
    _Var5 = std::
            map<std::__cxx11::string,flatbuffers::Definition_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
            ::insert<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
                      ((map<std::__cxx11::string,flatbuffers::Definition_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
                        *)&nsDef.ns,&local_210);
    local_228 = (_Base_ptr)_Var5.first._M_node;
    local_220 = _Var5.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
    ::~pair(&local_210);
    std::__cxx11::string::operator=
              ((string *)(nsDef.filepath.field_2._M_local_buf + 8),(string *)local_80);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](&this->ns_defs_,(key_type *)((long)&filepath.field_2 + 8));
    anon_unknown_10::NsDefinition::operator=(pmVar4,(NsDefinition *)local_1e8);
    anon_unknown_10::NsDefinition::~NsDefinition((NsDefinition *)local_1e8);
  }
  else {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
             ::operator[](&this->ns_defs_,(key_type *)((long)&filepath.field_2 + 8));
    local_258 = definition;
    std::make_pair<std::__cxx11::string&,flatbuffers::Definition_const*>
              (&local_250,type_name,&local_258);
    std::
    map<std::__cxx11::string,flatbuffers::Definition_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
    ::insert<std::pair<std::__cxx11::string,flatbuffers::Definition_const*>>
              ((map<std::__cxx11::string,flatbuffers::Definition_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::Definition_const*>>>
                *)&pmVar4->definitions,&local_250);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_flatbuffers::Definition_*>
    ::~pair(&local_250);
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(symbolic_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void TrackNsDef(const Definition &definition, std::string type_name) {
    std::string path;
    std::string filepath;
    std::string symbolic_name;
    if (definition.defined_namespace->components.size() > 0) {
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::TrailingPathSeperator);
      filepath = path + ".ts";
      path = namer_.Directories(*definition.defined_namespace,
                                SkipDir::OutputPathAndTrailingPathSeparator);
      symbolic_name = definition.defined_namespace->components.back();
    } else {
      auto def_mod_name = namer_.File(definition, SkipFile::SuffixAndExtension);
      symbolic_name = file_name_;
      filepath = path_ + symbolic_name + ".ts";
    }
    if (ns_defs_.count(path) == 0) {
      NsDefinition nsDef;
      nsDef.path = path;
      nsDef.filepath = filepath;
      nsDef.ns = definition.defined_namespace;
      nsDef.definitions.insert(std::make_pair(type_name, &definition));
      nsDef.symbolic_name = symbolic_name;
      ns_defs_[path] = nsDef;
    } else {
      ns_defs_[path].definitions.insert(std::make_pair(type_name, &definition));
    }
  }